

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

void __thiscall docopt::value::value(value *this,value *other)

{
  Kind KVar1;
  Variant *this_00;
  
  KVar1 = other->kind;
  this->kind = KVar1;
  if (KVar1 - Bool < 4) {
    this_00 = &this->variant;
    switch(KVar1) {
    case Bool:
      this_00->boolValue = (other->variant).boolValue;
      break;
    case Long:
      this_00->longValue = (other->variant).longValue;
      break;
    case String:
      std::__cxx11::string::string
                ((string *)&this_00->strValue,(string *)&(other->variant).strValue);
      return;
    case StringList:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&this_00->strList,&(other->variant).strList);
      return;
    }
  }
  return;
}

Assistant:

inline
	value::value(value const& other)
	: kind(other.kind)
	{
		switch (kind) {
			case Kind::String:
				new (&variant.strValue) std::string(other.variant.strValue);
				break;

			case Kind::StringList:
				new (&variant.strList) std::vector<std::string>(other.variant.strList);
				break;

			case Kind::Bool:
				variant.boolValue = other.variant.boolValue;
				break;

			case Kind::Long:
				variant.longValue = other.variant.longValue;
				break;

			case Kind::Empty:
			default:
				break;
		}
	}